

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O2

int gost_grasshopper_get_asn1_parameters(EVP_CIPHER_CTX *ctx,ASN1_TYPE *params)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  uchar *puVar5;
  undefined8 *puVar6;
  uchar iv [16];
  
  uVar3 = EVP_CIPHER_CTX_get0_cipher();
  iVar1 = EVP_CIPHER_get_mode(uVar3);
  iVar2 = 0;
  if (iVar1 == 5) {
    lVar4 = EVP_CIPHER_CTX_get_cipher_data(ctx);
    iVar1 = gost2015_get_asn1_params(params,0x10,iv,8,(uchar *)(lVar4 + 0x1ac));
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    else {
      puVar5 = (uchar *)EVP_CIPHER_CTX_iv_noconst(ctx);
      *(undefined4 *)puVar5 = iv._0_4_;
      *(undefined4 *)(puVar5 + 4) = iv._4_4_;
      *(undefined4 *)(puVar5 + 8) = iv._8_4_;
      *(undefined4 *)(puVar5 + 0xc) = iv._12_4_;
      puVar6 = (undefined8 *)EVP_CIPHER_CTX_original_iv(ctx);
      *puVar6 = CONCAT44(iv._4_4_,iv._0_4_);
      puVar6[1] = CONCAT44(iv._12_4_,iv._8_4_);
      *(undefined4 *)(lVar4 + 0x1a8) = 0x40000;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static GRASSHOPPER_INLINE int
gost_grasshopper_get_asn1_parameters(EVP_CIPHER_CTX *ctx, ASN1_TYPE *params)
{
    if (EVP_CIPHER_CTX_mode(ctx) == EVP_CIPH_CTR_MODE) {
        gost_grasshopper_cipher_ctx_ctr *ctr = EVP_CIPHER_CTX_get_cipher_data(ctx);

        int iv_len = 16;
        unsigned char iv[16];

        if (gost2015_get_asn1_params(params, 16, iv, 8, ctr->kdf_seed) == 0) {
            return 0;
        }

        memcpy(EVP_CIPHER_CTX_iv_noconst(ctx), iv, iv_len);
        memcpy((unsigned char *)EVP_CIPHER_CTX_original_iv(ctx), iv, iv_len);

        /* CMS implies 256kb section_size */
        ctr->section_size = 256*1024;
        return 1;
    }
    return 0;
}